

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<VmModule::LoadStoreInfo,_32U>::SmallArray
          (SmallArray<VmModule::LoadStoreInfo,_32U> *this,Allocator *allocator)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0x30;
  do {
    puVar1 = (undefined8 *)((long)this->little + lVar2 + -0x24);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->little + lVar2 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->little + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined2 *)((long)&this->little[0].loadAddress + lVar2) = 0;
    puVar1 = (undefined8 *)((long)&this->little[0].loadInst + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->little[0].copyInst + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x58;
  } while (lVar2 != 0xb30);
  this->allocator = allocator;
  this->data = this->little;
  this->count = 0;
  this->max = 0x20;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}